

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_constraints.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  double dVar3;
  void *flagvalue;
  SUNContext ctx;
  sunrealtype h0;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype w0;
  sunrealtype v0;
  sunrealtype u0;
  long nctf;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  int iout;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  void *arkode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector constraints;
  N_Vector y;
  int flag;
  sunindextype NEQ;
  int Nt;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  sunrealtype ONE;
  double in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  sunrealtype atol;
  sunrealtype rtol;
  sunrealtype t_00;
  N_Vector in_stack_ffffffffffffff18;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  int local_84;
  double local_80;
  double local_78;
  FILE *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  long *local_48;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  double local_28;
  double local_20;
  double local_18;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0x3ff0000000000000;
  local_18 = 0.0;
  local_20 = 100000000000.0;
  local_28 = 1000000000.0;
  dVar3 = ceil(100.0);
  local_2c = (int)dVar3;
  local_38 = 3;
  local_48 = (long *)0x0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  t_00 = 1.0;
  rtol = 0.0;
  atol = 0.0;
  flagvalue = (void *)0x3e7ad7f29abcaf49;
  local_3c = SUNContext_Create(0,&stack0xfffffffffffffee0);
  iVar2 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
  if (iVar1 == 0) {
    printf("\nRobertson ODE test problem:\n");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",t_00,rtol,atol);
    local_48 = (long *)N_VNew_Serial(local_38,in_stack_fffffffffffffee0);
    iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
    if (iVar1 == 0) {
      **(sunrealtype **)(*local_48 + 0x10) = t_00;
      *(sunrealtype *)(*(long *)(*local_48 + 0x10) + 8) = rtol;
      *(sunrealtype *)(*(long *)(*local_48 + 0x10) + 0x10) = atol;
      local_50 = N_VClone(local_48);
      iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
      if (iVar1 == 0) {
        N_VConst(local_10,local_50);
        local_68 = ARKStepCreate(local_18,0,f,local_48,in_stack_fffffffffffffee0);
        iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
        if (iVar1 == 0) {
          local_3c = ARKodeSetInitStep(flagvalue,local_68);
          iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
          if (iVar1 == 0) {
            local_3c = ARKodeSetMaxErrTestFails(local_68,0x14);
            iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
            if (iVar1 == 0) {
              local_3c = ARKodeSetMaxNonlinIters(local_68,8);
              iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
              if (iVar1 == 0) {
                local_3c = ARKodeSetNonlinConvCoef(0x3e7ad7f29abcaf48,local_68);
                iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                if (iVar1 == 0) {
                  local_3c = ARKodeSetMaxNumSteps(local_68,100000);
                  iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                  if (iVar1 == 0) {
                    local_3c = ARKodeSetPredictorMethod(local_68,1);
                    iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                    if (iVar1 == 0) {
                      local_3c = ARKodeSStolerances(0x3f50624dd2f1a9fc,0x3e7ad7f29abcaf48,local_68);
                      iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                      if (iVar1 == 0) {
                        local_3c = ARKodeSetConstraints(local_68,local_50);
                        iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                        if (iVar1 == 0) {
                          local_58 = SUNDenseMatrix(local_38,local_38,in_stack_fffffffffffffee0);
                          iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                          if (iVar1 == 0) {
                            local_60 = SUNLinSol_Dense(local_48,local_58,in_stack_fffffffffffffee0);
                            iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                            if (iVar1 == 0) {
                              local_3c = ARKodeSetLinearSolver(local_68,local_60,local_58);
                              iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                              if (iVar1 == 0) {
                                local_3c = ARKodeSetJacFn(local_68,Jac);
                                iVar1 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar2);
                                if (iVar1 == 0) {
                                  local_70 = fopen("solution.txt","w");
                                  fprintf(local_70,"# t u v w\n");
                                  fprintf(local_70," %.16e %.16e %.16e %.16e\n",local_18,
                                          **(undefined8 **)(*local_48 + 0x10),
                                          *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                          *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                  local_78 = local_18;
                                  local_80 = local_18 + local_28;
                                  printf("        t           u           v           w\n");
                                  printf("   --------------------------------------------------\n");
                                  printf("  %10.3e  %12.5e  %12.5e  %12.5e\n",local_78,
                                         **(undefined8 **)(*local_48 + 0x10),
                                         *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                         *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                  for (local_84 = 0;
                                      iVar1 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                                      local_84 < local_2c; local_84 = local_84 + 1) {
                                    local_3c = ARKodeEvolve(local_80,local_68,local_48,&local_78,1);
                                    iVar2 = check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                    if (iVar2 != 0) break;
                                    printf("  %10.3e  %12.5e  %12.5e  %12.5e\n",local_78,
                                           **(undefined8 **)(*local_48 + 0x10),
                                           *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                           *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                    fprintf(local_70," %.16e %.16e %.16e %.16e\n",local_78,
                                            **(undefined8 **)(*local_48 + 0x10),
                                            *(undefined8 *)(*(long *)(*local_48 + 0x10) + 8),
                                            *(undefined8 *)(*(long *)(*local_48 + 0x10) + 0x10));
                                    if (local_3c < 0) {
                                      fprintf(_stderr,"Solver failure, stopping integration\n");
                                      break;
                                    }
                                    in_stack_fffffffffffffed8 = local_28 + local_80;
                                    if (local_20 < in_stack_fffffffffffffed8) {
                                      in_stack_fffffffffffffed8 = local_20;
                                    }
                                    local_80 = in_stack_fffffffffffffed8;
                                  }
                                  printf("   --------------------------------------------------\n");
                                  fclose(local_70);
                                  local_3c = ARKodeGetNumSteps(local_68,&local_90);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumStepAttempts(local_68,&local_98);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKStepGetNumRhsEvals(local_68,&local_a0,&local_a8);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumLinSolvSetups(local_68,&local_b0);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumErrTestFails(local_68,&local_e0);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumStepSolveFails(local_68,&local_d8);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumNonlinSolvIters(local_68,&local_c8);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumNonlinSolvConvFails(local_68,&local_d0);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumJacEvals(local_68,&local_b8);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumLinRhsEvals(local_68,&local_c0);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  local_3c = ARKodeGetNumConstrFails
                                                       (local_68,&stack0xffffffffffffff18);
                                  check_flag(flagvalue,in_stack_fffffffffffffee0,iVar1);
                                  printf("\nFinal Solver Statistics:\n");
                                  printf("   Internal solver steps = %li (attempted = %li)\n",
                                         local_90,local_98);
                                  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_a0,
                                         local_a8);
                                  printf("   Total linear solver setups = %li\n",local_b0);
                                  printf("   Total RHS evals for setting up the linear system = %li\n"
                                         ,local_c0);
                                  printf("   Total number of Jacobian evaluations = %li\n",local_b8)
                                  ;
                                  printf("   Total number of Newton iterations = %li\n",local_c8);
                                  printf("   Total number of nonlinear solver convergence failures = %li\n"
                                         ,local_d0);
                                  printf("   Total number of error test failures = %li\n",local_e0);
                                  printf("   Total number of constraint test failures = %li\n",
                                         in_stack_ffffffffffffff18);
                                  printf("   Total number of failed steps from solver failure = %li\n"
                                         ,local_d8);
                                  local_3c = check_ans(in_stack_ffffffffffffff18,t_00,rtol,atol);
                                  N_VDestroy(local_48);
                                  N_VDestroy(local_50);
                                  ARKodeFree(&local_68);
                                  SUNLinSolFree(local_60);
                                  SUNMatDestroy(local_58);
                                  SUNContext_Free(&stack0xfffffffffffffee0);
                                  local_4 = local_3c;
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  sunrealtype ONE = SUN_RCONST(1.0);

  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(1.e11);     /* final time */
  sunrealtype dTout = (Tf - T0) / 100;       /* time between outputs */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */

  /* general problem variables */
  int flag;                    /* reusable error-checking flag */
  N_Vector y           = NULL; /* empty vector for storing solution */
  N_Vector constraints = NULL; /* empty vector for storing constraints */
  SUNMatrix A          = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS   = NULL; /* empty linear solver object */
  void* arkode_mem     = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nctf;

  /* set up the initial conditions, tolerances, initial time step size */
  sunrealtype u0     = SUN_RCONST(1.0);
  sunrealtype v0     = SUN_RCONST(0.0);
  sunrealtype w0     = SUN_RCONST(0.0);
  sunrealtype reltol = SUN_RCONST(1.0e-3);
  sunrealtype abstol = SUN_RCONST(1.0e-7);
  sunrealtype h0     = SUN_RCONST(1.0e-4) * reltol;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nRobertson ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions into y */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  constraints = N_VClone(y);
  if (check_flag((void*)constraints, "N_VNew_Serial", 0)) { return 1; }
  /* Set constraints to all 1's for nonnegative solution values. */
  N_VConst(ONE, constraints);

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetInitStep(arkode_mem, h0); /* Set custom initial step */
  if (check_flag(&flag, "ARKodeSetInitStep", 1)) { return 1; }
  flag = ARKodeSetMaxErrTestFails(arkode_mem,
                                  20); /* Increase max error test fails */
  if (check_flag(&flag, "ARKodeSetMaxErrTestFails", 1)) { return 1; }
  flag = ARKodeSetMaxNonlinIters(arkode_mem, 8); /* Increase max nonlin iters  */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }
  flag = ARKodeSetNonlinConvCoef(arkode_mem,
                                 SUN_RCONST(1.e-7)); /* Set nonlinear convergence coeff. */
  if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 100000); /* Increase max num steps */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem,
                                  1); /* Specify maximum-order predictor */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKodeSetConstraints(arkode_mem, constraints); /* Set constraints */
  if (check_flag(&flag, "ARKodeSetConstraints", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   --------------------------------------------------\n");
  printf("  %10.3" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
  for (iout = 0; iout < Nt; iout++)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %10.3" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   --------------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);
  flag = ARKodeGetNumConstrFails(arkode_mem, &nctf);
  check_flag(&flag, "ARKodeGetNumConstrFails", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of constraint test failures = %li\n", nctf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* check the solution error */
  flag = check_ans(y, t, reltol, abstol);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  N_VDestroy(constraints); /* Free constraints vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return flag;
}